

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

Result * __thiscall
httplib::ClientImpl::Post
          (Result *__return_storage_ptr__,ClientImpl *this,char *path,Headers *headers,string *body,
          char *content_type)

{
  ContentProvider content_provider;
  code *pcVar1;
  
  pcVar1 = (code *)0x0;
  content_provider.super__Function_base._M_functor._8_8_ = &stack0xffffffffffffffa8;
  content_provider.super__Function_base._M_functor._M_unused._M_object = &stack0xffffffffffffffc8;
  content_provider.super__Function_base._M_manager = (_Manager_type)content_type;
  content_provider._M_invoker = (_Invoker_type)0x0;
  send_with_content_provider
            (__return_storage_ptr__,this,"POST",path,headers,(body->_M_dataplus)._M_p,
             body->_M_string_length,content_provider,
             (ContentProviderWithoutLength)ZEXT1632(ZEXT816(0)),(char *)0x0);
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&stack0xffffffffffffffa8,&stack0xffffffffffffffa8,3);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::Post(const char *path, const Headers &headers,
                               const std::string &body,
                               const char *content_type) {
  return send_with_content_provider("POST", path, headers, body.data(),
                                    body.size(), nullptr, nullptr,
                                    content_type);
}